

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Context.cpp
# Opt level: O3

PC * __thiscall
Hpipe::Context::forward(PC *__return_storage_ptr__,Context *this,int type,bool never_ending)

{
  CharItem *item;
  pointer pCVar1;
  bool bVar2;
  pointer ppCVar3;
  uint uVar4;
  pointer pCVar5;
  ulong uVar6;
  uint ind;
  PcMaker pm;
  PcMaker local_c0;
  
  anon_unknown_7::PcMaker::PcMaker(&local_c0,this);
  ppCVar3 = (this->pos).
            super_vector<const_Hpipe::CharItem_*,_std::allocator<const_Hpipe::CharItem_*>_>.
            super__Vector_base<const_Hpipe::CharItem_*,_std::allocator<const_Hpipe::CharItem_*>_>.
            _M_impl.super__Vector_impl_data._M_start;
  if ((this->pos).super_vector<const_Hpipe::CharItem_*,_std::allocator<const_Hpipe::CharItem_*>_>.
      super__Vector_base<const_Hpipe::CharItem_*,_std::allocator<const_Hpipe::CharItem_*>_>._M_impl.
      super__Vector_impl_data._M_finish != ppCVar3) {
    uVar6 = 0;
    do {
      item = ppCVar3[uVar6];
      ind = (uint)uVar6;
      if (item->type == type) {
        pCVar1 = (item->edges).super_vector<Hpipe::CharEdge,_std::allocator<Hpipe::CharEdge>_>.
                 super__Vector_base<Hpipe::CharEdge,_std::allocator<Hpipe::CharEdge>_>._M_impl.
                 super__Vector_impl_data._M_finish;
        for (pCVar5 = (item->edges).super_vector<Hpipe::CharEdge,_std::allocator<Hpipe::CharEdge>_>.
                      super__Vector_base<Hpipe::CharEdge,_std::allocator<Hpipe::CharEdge>_>._M_impl.
                      super__Vector_impl_data._M_start; pCVar5 != pCVar1; pCVar5 = pCVar5 + 1) {
          if ((long)local_c0.res.first.pos.
                    super_vector<const_Hpipe::CharItem_*,_std::allocator<const_Hpipe::CharItem_*>_>.
                    super__Vector_base<const_Hpipe::CharItem_*,_std::allocator<const_Hpipe::CharItem_*>_>
                    ._M_impl.super__Vector_impl_data._M_finish -
              (long)local_c0.res.first.pos.
                    super_vector<const_Hpipe::CharItem_*,_std::allocator<const_Hpipe::CharItem_*>_>.
                    super__Vector_base<const_Hpipe::CharItem_*,_std::allocator<const_Hpipe::CharItem_*>_>
                    ._M_impl.super__Vector_impl_data._M_start != 0) {
            uVar4 = 1;
            uVar6 = 0;
            do {
              if (local_c0.res.first.pos.
                  super_vector<const_Hpipe::CharItem_*,_std::allocator<const_Hpipe::CharItem_*>_>.
                  super__Vector_base<const_Hpipe::CharItem_*,_std::allocator<const_Hpipe::CharItem_*>_>
                  ._M_impl.super__Vector_impl_data._M_start[uVar6] == pCVar5->item)
              goto LAB_00145445;
              uVar6 = (ulong)uVar4;
              uVar4 = uVar4 + 1;
            } while (uVar6 < (ulong)((long)local_c0.res.first.pos.
                                           super_vector<const_Hpipe::CharItem_*,_std::allocator<const_Hpipe::CharItem_*>_>
                                           .
                                           super__Vector_base<const_Hpipe::CharItem_*,_std::allocator<const_Hpipe::CharItem_*>_>
                                           ._M_impl.super__Vector_impl_data._M_finish -
                                     (long)local_c0.res.first.pos.
                                           super_vector<const_Hpipe::CharItem_*,_std::allocator<const_Hpipe::CharItem_*>_>
                                           .
                                           super__Vector_base<const_Hpipe::CharItem_*,_std::allocator<const_Hpipe::CharItem_*>_>
                                           ._M_impl.super__Vector_impl_data._M_start >> 3));
          }
          anon_unknown_7::PcMaker::add(&local_c0,pCVar5->item,ind,true);
          bVar2 = CharGraph::leads_to_ok((Vec<const_Hpipe::CharItem_*> *)&local_c0,never_ending);
          if (bVar2) {
            std::pair<Hpipe::Context,_Hpipe::Vec<unsigned_int>_>::pair
                      (__return_storage_ptr__,&local_c0.res);
            goto LAB_001454d7;
          }
LAB_00145445:
        }
      }
      else {
        if ((long)local_c0.res.first.pos.
                  super_vector<const_Hpipe::CharItem_*,_std::allocator<const_Hpipe::CharItem_*>_>.
                  super__Vector_base<const_Hpipe::CharItem_*,_std::allocator<const_Hpipe::CharItem_*>_>
                  ._M_impl.super__Vector_impl_data._M_finish -
            (long)local_c0.res.first.pos.
                  super_vector<const_Hpipe::CharItem_*,_std::allocator<const_Hpipe::CharItem_*>_>.
                  super__Vector_base<const_Hpipe::CharItem_*,_std::allocator<const_Hpipe::CharItem_*>_>
                  ._M_impl.super__Vector_impl_data._M_start != 0) {
          uVar4 = 1;
          uVar6 = 0;
          do {
            if (local_c0.res.first.pos.
                super_vector<const_Hpipe::CharItem_*,_std::allocator<const_Hpipe::CharItem_*>_>.
                super__Vector_base<const_Hpipe::CharItem_*,_std::allocator<const_Hpipe::CharItem_*>_>
                ._M_impl.super__Vector_impl_data._M_start[uVar6] == item) goto LAB_00145497;
            uVar6 = (ulong)uVar4;
            uVar4 = uVar4 + 1;
          } while (uVar6 < (ulong)((long)local_c0.res.first.pos.
                                         super_vector<const_Hpipe::CharItem_*,_std::allocator<const_Hpipe::CharItem_*>_>
                                         .
                                         super__Vector_base<const_Hpipe::CharItem_*,_std::allocator<const_Hpipe::CharItem_*>_>
                                         ._M_impl.super__Vector_impl_data._M_finish -
                                   (long)local_c0.res.first.pos.
                                         super_vector<const_Hpipe::CharItem_*,_std::allocator<const_Hpipe::CharItem_*>_>
                                         .
                                         super__Vector_base<const_Hpipe::CharItem_*,_std::allocator<const_Hpipe::CharItem_*>_>
                                         ._M_impl.super__Vector_impl_data._M_start >> 3));
        }
        anon_unknown_7::PcMaker::add(&local_c0,item,ind,true);
        bVar2 = CharGraph::leads_to_ok((Vec<const_Hpipe::CharItem_*> *)&local_c0,never_ending);
        if (bVar2) {
          std::pair<Hpipe::Context,_Hpipe::Vec<unsigned_int>_>::pair
                    (__return_storage_ptr__,&local_c0.res);
          goto LAB_001454d7;
        }
      }
LAB_00145497:
      uVar6 = (ulong)(ind + 1);
      ppCVar3 = (this->pos).
                super_vector<const_Hpipe::CharItem_*,_std::allocator<const_Hpipe::CharItem_*>_>.
                super__Vector_base<const_Hpipe::CharItem_*,_std::allocator<const_Hpipe::CharItem_*>_>
                ._M_impl.super__Vector_impl_data._M_start;
    } while (uVar6 < (ulong)((long)(this->pos).
                                   super_vector<const_Hpipe::CharItem_*,_std::allocator<const_Hpipe::CharItem_*>_>
                                   .
                                   super__Vector_base<const_Hpipe::CharItem_*,_std::allocator<const_Hpipe::CharItem_*>_>
                                   ._M_impl.super__Vector_impl_data._M_finish - (long)ppCVar3 >> 3))
    ;
  }
  std::pair<Hpipe::Context,_Hpipe::Vec<unsigned_int>_>::pair(__return_storage_ptr__,&local_c0.res);
LAB_001454d7:
  if (local_c0.res.second.super_vector<unsigned_int,_std::allocator<unsigned_int>_>.
      super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_c0.res.second.super_vector<unsigned_int,_std::allocator<unsigned_int>_>.
                    super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_c0.res.second.
                          super_vector<unsigned_int,_std::allocator<unsigned_int>_>.
                          super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_c0.res.second.
                          super_vector<unsigned_int,_std::allocator<unsigned_int>_>.
                          super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Hpipe::Vec<unsigned_int>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Hpipe::Vec<unsigned_int>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Hpipe::Vec<unsigned_int>_>_>_>
  ::~_Rb_tree(&local_c0.res.first.paths_to_strings._M_t);
  if (local_c0.res.first.paths_to_mark.super_vector<unsigned_int,_std::allocator<unsigned_int>_>.
      super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_c0.res.first.paths_to_mark.
                    super_vector<unsigned_int,_std::allocator<unsigned_int>_>.
                    super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_c0.res.first.paths_to_mark.
                          super_vector<unsigned_int,_std::allocator<unsigned_int>_>.
                          super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_c0.res.first.paths_to_mark.
                          super_vector<unsigned_int,_std::allocator<unsigned_int>_>.
                          super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  if (local_c0.res.first.pos.
      super_vector<const_Hpipe::CharItem_*,_std::allocator<const_Hpipe::CharItem_*>_>.
      super__Vector_base<const_Hpipe::CharItem_*,_std::allocator<const_Hpipe::CharItem_*>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_c0.res.first.pos.
                    super_vector<const_Hpipe::CharItem_*,_std::allocator<const_Hpipe::CharItem_*>_>.
                    super__Vector_base<const_Hpipe::CharItem_*,_std::allocator<const_Hpipe::CharItem_*>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_c0.res.first.pos.
                          super_vector<const_Hpipe::CharItem_*,_std::allocator<const_Hpipe::CharItem_*>_>
                          .
                          super__Vector_base<const_Hpipe::CharItem_*,_std::allocator<const_Hpipe::CharItem_*>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_c0.res.first.pos.
                          super_vector<const_Hpipe::CharItem_*,_std::allocator<const_Hpipe::CharItem_*>_>
                          .
                          super__Vector_base<const_Hpipe::CharItem_*,_std::allocator<const_Hpipe::CharItem_*>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  return __return_storage_ptr__;
}

Assistant:

Context::PC Context::forward( int type, bool never_ending ) const {
    PcMaker pm( this );

    for( unsigned i = 0; i < pos.size(); ++i ) {
        const CharItem *item = pos[ i ];
        if ( item->type == type ) {
            for( const CharEdge &e : item->edges ) {
                if ( not pm.has( e.item ) ) {
                    pm.add( e.item, i );
                    if ( pm.leads_to_ok( never_ending ) )
                        return pm.out();
                }
            }
        } else if ( not pm.has( item ) ) {
            pm.add( item, i );
            if ( pm.leads_to_ok( never_ending ) )
                return pm.out();
        }
    }

    return pm.out();
}